

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerThread.cpp
# Opt level: O1

void __thiscall PathTracerThread::viewer_thread_func(PathTracerThread *this)

{
  double dVar1;
  int iVar2;
  logger *plVar3;
  undefined4 extraout_var;
  shared_ptr<myvk::CommandBuffer> viewer_command_buffer;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::CommandPool> main_command_pool;
  undefined1 local_68 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  plVar3 = spdlog::default_logger_raw();
  local_68._0_8_ = (CommandBuffer *)0x0;
  local_68._8_8_ = (element_type *)0x0;
  local_68._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dVar1 = spdlog::logger::log(plVar3,0.0);
  iVar2 = (*(((this->m_main_queue).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])(SUB84(dVar1,0));
  myvk::CommandPool::Create((CommandPool *)(local_68 + 0x28),&this->m_main_queue,0);
  myvk::Fence::Create((Fence *)(local_68 + 0x18),(Ptr<Device> *)CONCAT44(extraout_var,iVar2),0);
  if (((this->m_run)._M_base._M_i & 1U) != 0) {
    do {
      myvk::CommandBuffer::Create
                ((CommandBuffer *)local_68,(Ptr<CommandPool> *)(local_68 + 0x28),
                 VK_COMMAND_BUFFER_LEVEL_PRIMARY);
      myvk::CommandBuffer::Begin((CommandBuffer *)local_68._0_8_,0);
      PathTracerViewer::CmdGenRenderPass
                ((this->m_path_tracer_viewer_ptr).
                 super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (shared_ptr<myvk::CommandBuffer> *)local_68);
      myvk::CommandBuffer::End((CommandBuffer *)local_68._0_8_);
      myvk::Fence::Reset((Fence *)local_68._24_8_);
      myvk::CommandBuffer::Submit((CommandBuffer *)local_68._0_8_,(Ptr<Fence> *)(local_68 + 0x18));
      myvk::Fence::Wait((Fence *)local_68._24_8_,0xffffffffffffffff);
      if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      plVar3 = spdlog::default_logger_raw();
      local_68._0_8_ = (_func_int **)0x0;
      local_68._8_8_ = (element_type *)0x0;
      local_68._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      spdlog::logger::log(plVar3,0.0);
      local_68._8_8_ = local_68._8_8_ & 0xffffffffffffff00;
      local_68._0_8_ = &(this->m_viewer_semaphore).m_mtx;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
      local_68[8] = 1;
      if ((this->m_viewer_semaphore).m_state == false) {
        do {
          std::condition_variable::wait((unique_lock *)&(this->m_viewer_semaphore).m_cv);
        } while ((this->m_viewer_semaphore).m_state != true);
      }
      (this->m_viewer_semaphore).m_state = false;
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
    } while (((this->m_run)._M_base._M_i & 1U) != 0);
  }
  plVar3 = spdlog::default_logger_raw();
  local_68._0_8_ = (_func_int **)0x0;
  local_68._8_8_ = (element_type *)0x0;
  local_68._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  spdlog::logger::log(plVar3,0.0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._32_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._32_8_);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

void PathTracerThread::viewer_thread_func() {
	spdlog::info("Enter path tracer viewer thread");

	const std::shared_ptr<myvk::Device> &device = m_main_queue->GetDevicePtr();
	const std::shared_ptr<PathTracer> &path_tracer = m_path_tracer_viewer_ptr->GetPathTracerPtr();

	std::shared_ptr<myvk::CommandPool> main_command_pool = myvk::CommandPool::Create(m_main_queue);

	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(device);
	while (m_run.load(std::memory_order_acquire)) {
		{
			std::shared_ptr<myvk::CommandBuffer> viewer_command_buffer = myvk::CommandBuffer::Create(main_command_pool);
			viewer_command_buffer->Begin();
			m_path_tracer_viewer_ptr->CmdGenRenderPass(viewer_command_buffer);
			viewer_command_buffer->End();

			fence->Reset();
			viewer_command_buffer->Submit(fence);
			fence->Wait();
		}

		spdlog::debug("m_viewer_semaphore wait");
		m_viewer_semaphore.wait();
	}

	spdlog::info("Quit path tracer viewer thread");
}